

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureCubeSizeCase::init(TextureCubeSizeCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TextureCube *this_00;
  TextureCube *pTVar2;
  PixelBufferAccess *access;
  int local_3c;
  CubeFace local_28;
  int local_24;
  int face;
  int levelNdx;
  int numLevels;
  TextureCubeSizeCase *this_local;
  
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width);
  this->m_texture = this_00;
  if (init()::gradients == '\0') {
    iVar1 = __cxa_guard_acquire(&init()::gradients);
    if (iVar1 != 0) {
      tcu::Vector<float,_4>::Vector(init::gradients[0],-1.0,-1.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[0] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1],0.0,-1.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2],-1.0,0.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3],-1.0,-1.0,0.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4],-1.0,-1.0,-1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4] + 1,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5],0.0,0.0,0.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5] + 1,1.0,1.0,1.0,0.0);
      __cxa_guard_release(&init()::gradients);
    }
  }
  if ((this->m_useMipmaps & 1U) == 0) {
    local_3c = 1;
  }
  else {
    iVar1 = de::max<int>(this->m_width,this->m_height);
    local_3c = ::deLog2Floor32(iVar1);
    local_3c = local_3c + 1;
  }
  for (local_24 = 0; local_24 < local_3c; local_24 = local_24 + 1) {
    for (local_28 = CUBEFACE_NEGATIVE_X; (int)local_28 < 6;
        local_28 = local_28 + CUBEFACE_POSITIVE_X) {
      pTVar2 = glu::TextureCube::getRefTexture(this->m_texture);
      tcu::TextureCube::allocLevel(pTVar2,local_28,local_24);
      pTVar2 = glu::TextureCube::getRefTexture(this->m_texture);
      access = tcu::TextureCube::getLevelFace(pTVar2,local_24,local_28);
      tcu::fillWithComponentGradients
                (access,init::gradients[(int)local_28],init::gradients[(int)local_28] + 1);
    }
  }
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  return (int)this;
}

Assistant:

void TextureCubeSizeCase::init (void)
{
	DE_ASSERT(!m_texture);
	DE_ASSERT(m_width == m_height);
	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_width);

	static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
	{
		{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
		{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
		{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
		{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
		{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
	};

	int numLevels = m_useMipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;

	// Fill levels.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
			fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0], gradients[face][1]);
		}
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}